

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O2

int tok_scan_defsym(tokcxdef *ctx,char *p,int len)

{
  byte bVar1;
  int iVar2;
  ushort **ppuVar3;
  long lVar4;
  
  ppuVar3 = __ctype_b_loc();
  bVar1 = *p;
  if (((((*ppuVar3)[bVar1] >> 10 & 1) == 0) && (bVar1 != 0x5f)) && (bVar1 != 0x24)) {
    errlogf(ctx->tokcxerr,"TADS",0x12d);
    iVar2 = 0;
  }
  else {
    for (lVar4 = 0;
        (iVar2 = len, len != (int)lVar4 &&
        (((bVar1 = p[lVar4], ((*ppuVar3)[bVar1] & 0xc00) != 0 || (bVar1 == 0x5f)) ||
         (iVar2 = (int)lVar4, bVar1 == 0x24)))); lVar4 = lVar4 + 1) {
    }
  }
  return iVar2;
}

Assistant:

static int tok_scan_defsym(tokcxdef *ctx, char *p, int len)
{
    int symlen;

    /* make sure it's a valid symbol */
    if (!(isalpha((uchar)*p) || *p == '_' || *p == '$'))
    {
        errlog(ctx->tokcxerr, ERR_REQSYM);
        return 0;
    }

    /* count characters as long as we have valid symbol characters */
    for (symlen = 0 ; len && TOKISSYM(*p) ; ++p, --len, ++symlen) ;
    return symlen;
}